

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall FPlayerNameBox::DrawBorder(FPlayerNameBox *this,int x,int y,int len)

{
  FTextureID FVar1;
  undefined4 in_register_00000014;
  FTexture *img;
  FTexture *img_00;
  FTexture *img_01;
  bool bVar2;
  double x_00;
  double y_00;
  
  FVar1 = FTextureManager::CheckForTexture(&TexMan,"M_LSLEFT",8,1);
  if ((uint)FVar1.texnum < TexMan.Textures.Count) {
    img_01 = TexMan.Textures.Array[FVar1.texnum].Texture;
  }
  else {
    img_01 = (FTexture *)0x0;
  }
  FVar1 = FTextureManager::CheckForTexture(&TexMan,"M_LSCNTR",8,1);
  if ((uint)FVar1.texnum < TexMan.Textures.Count) {
    img_00 = TexMan.Textures.Array[FVar1.texnum].Texture;
  }
  else {
    img_00 = (FTexture *)0x0;
  }
  FVar1 = FTextureManager::CheckForTexture(&TexMan,"M_LSRGHT",8,1);
  if ((uint)FVar1.texnum < TexMan.Textures.Count) {
    img = TexMan.Textures.Array[FVar1.texnum].Texture;
  }
  else {
    img = (FTexture *)0x0;
  }
  if (((img_00 == (FTexture *)0x0) || (img_01 == (FTexture *)0x0)) || (img == (FTexture *)0x0)) {
    FVar1 = FTextureManager::CheckForTexture(&TexMan,"M_FSLOT",8,1);
    if ((TexMan.Textures.Count <= (uint)FVar1.texnum) ||
       (img = TexMan.Textures.Array[FVar1.texnum].Texture, img == (FTexture *)0x0)) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (screen,(ulong)(uint)x,CONCAT44(in_register_00000014,y),(ulong)(uint)(len + x),
                 (ulong)(uint)((SmallFont->FontHeight * 3) / 2 + y),0xffffffffffffffff,0);
      return;
    }
    x_00 = (double)x;
    y_00 = (double)(y + 1);
  }
  else {
    y_00 = (double)(y + 7);
    DCanvas::DrawTexture((DCanvas *)screen,img_01,(double)(x + -8),y_00,0x40001390,1,0);
    if (len < 1) {
      len = 0;
    }
    while( true ) {
      x_00 = (double)x;
      bVar2 = len == 0;
      len = len + -1;
      if (bVar2) break;
      DCanvas::DrawTexture((DCanvas *)screen,img_00,x_00,y_00,0x40001390,1,0);
      x = x + 8;
    }
  }
  DCanvas::DrawTexture((DCanvas *)screen,img,x_00,y_00,0x40001390,1,0);
  return;
}

Assistant:

void FPlayerNameBox::DrawBorder (int x, int y, int len)
{
	FTexture *left = TexMan[TexMan.CheckForTexture("M_LSLEFT", FTexture::TEX_MiscPatch)];
	FTexture *mid = TexMan[TexMan.CheckForTexture("M_LSCNTR", FTexture::TEX_MiscPatch)];
	FTexture *right = TexMan[TexMan.CheckForTexture("M_LSRGHT", FTexture::TEX_MiscPatch)];
	if (left != NULL && right != NULL && mid != NULL)
	{
		int i;

		screen->DrawTexture (left, x-8, y+7, DTA_Clean, true, TAG_DONE);

		for (i = 0; i < len; i++)
		{
			screen->DrawTexture (mid, x, y+7, DTA_Clean, true, TAG_DONE);
			x += 8;
		}

		screen->DrawTexture (right, x, y+7, DTA_Clean, true, TAG_DONE);
	}
	else
	{
		FTexture *slot = TexMan[TexMan.CheckForTexture("M_FSLOT", FTexture::TEX_MiscPatch)];
		if (slot != NULL)
		{
			screen->DrawTexture (slot, x, y+1, DTA_Clean, true, TAG_DONE);
		}
		else
		{
			screen->Clear(x, y, x + len, y + SmallFont->GetHeight() * 3/2, -1, 0);
		}
	}
}